

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O3

void rndcurse(void)

{
  bool bVar1;
  bool bVar2;
  boolean bVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  obj *poVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  char Your_buf [256];
  char acStack_138 [264];
  
  if (((uwep != (obj *)0x0) && (uwep->oartifact == '\n')) &&
     (uVar5 = mt_random(), 0xccccccc < (uVar5 * -0x33333333 >> 2 | uVar5 * 0x40000000))) {
    pline("You feel a malignant aura surround %s.","the magic-absorbing blade");
    return;
  }
  if ((u.uprops[0x2c].extrinsic != 0) ||
     ((u.umonnum != u.umonster && (bVar3 = resists_magm(&youmonst), bVar3 != '\0')))) {
    shieldeff(u.ux,u.uy);
    pline("You feel a malignant aura surround %s.","you");
  }
  if (invent != (obj *)0x0) {
    uVar5 = 0;
    poVar7 = invent;
    do {
      uVar5 = uVar5 + (poVar7->oclass != '\f');
      poVar7 = poVar7->nobj;
    } while (poVar7 != (obj *)0x0);
    if (uVar5 != 0) {
      cVar4 = '\x02';
      if ((u.uprops[0x2c].extrinsic == 0) && (cVar4 = '\x01', u.umonnum != u.umonster)) {
        bVar3 = resists_magm(&youmonst);
        cVar4 = '\x02' - (bVar3 == '\0');
      }
      bVar1 = u.uprops[0x32].extrinsic != 0;
      bVar2 = u.uprops[0x32].intrinsic != 0;
      uVar6 = mt_random();
      iVar11 = uVar6 % (uint)(6 / (byte)((bVar1 || bVar2) + cVar4)) + 1;
      do {
        uVar6 = mt_random();
        if (invent != (obj *)0x0) {
          iVar10 = uVar6 % uVar5 + 1;
          poVar7 = invent;
          do {
            if ((poVar7->oclass != '\f') && (iVar10 = iVar10 + -1, iVar10 == 0)) {
              if ((poVar7->field_0x4a & 1) == 0) {
                if (((poVar7->oartifact == '\0') || (bVar3 = spec_ability(poVar7,4), bVar3 == '\0'))
                   || (uVar6 = mt_random(), 7 < uVar6 % 10)) {
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00245536;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00245531;
LAB_0024555c:
                    Shk_Your(acStack_138,poVar7);
                  }
                  else {
LAB_00245531:
                    if (ublindf != (obj *)0x0) {
LAB_00245536:
                      if (ublindf->oartifact == '\x1d') goto LAB_0024555c;
                    }
                  }
                  if ((poVar7->field_0x4a & 2) == 0) {
                    if (flags.verbose != '\0') {
                      if (u.uprops[0x1e].intrinsic == 0) {
                        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00245597;
                        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024558e;
LAB_002455f1:
                        pcVar8 = aobjnam(poVar7,"glow");
                        pcVar9 = hcolor("black");
                        pcVar9 = an(pcVar9);
                        pline("%s %s with %s aura.",acStack_138,pcVar8,pcVar9);
                      }
                      else {
LAB_0024558e:
                        if (ublindf != (obj *)0x0) {
LAB_00245597:
                          if (ublindf->oartifact == '\x1d') goto LAB_002455f1;
                        }
                      }
                    }
                    curse(poVar7);
                  }
                  else {
                    if (flags.verbose != '\0') {
                      if (u.uprops[0x1e].intrinsic == 0) {
                        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002455c4;
                        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002455bb;
LAB_00245665:
                        pcVar8 = aobjnam(poVar7,"glow");
                        pcVar9 = hcolor("brown");
                        pline("%s %s %s.",acStack_138,pcVar8,pcVar9);
                      }
                      else {
LAB_002455bb:
                        if (ublindf != (obj *)0x0) {
LAB_002455c4:
                          if (ublindf->oartifact == '\x1d') goto LAB_00245665;
                        }
                      }
                    }
                    unbless(poVar7);
                  }
                  poVar7->field_0x4a = poVar7->field_0x4a | 0x40;
                }
                else {
                  pcVar8 = Tobjnam(poVar7,"resist");
                  pline("%s!",pcVar8);
                }
              }
              break;
            }
            poVar7 = poVar7->nobj;
          } while (poVar7 != (obj *)0x0);
        }
        bVar1 = 1 < iVar11;
        iVar11 = iVar11 + -1;
      } while (bVar1);
      update_inventory();
    }
  }
  if (u.usteed == (monst *)0x0) {
    return;
  }
  uVar5 = mt_random();
  if ((uVar5 & 3) != 0) {
    return;
  }
  poVar7 = which_armor(u.usteed,0x100000);
  if (poVar7 == (obj *)0x0) {
    return;
  }
  if ((*(uint *)&poVar7->field_0x4a & 1) != 0) {
    return;
  }
  if ((*(uint *)&poVar7->field_0x4a & 2) == 0) {
    curse(poVar7);
  }
  else {
    unbless(poVar7);
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_00245758;
      goto LAB_0024572d;
    }
  }
  else {
LAB_0024572d:
    if (ublindf == (obj *)0x0) {
      return;
    }
  }
  if (ublindf->oartifact != '\x1d') {
    return;
  }
LAB_00245758:
  pcVar8 = y_monnam(u.usteed);
  pcVar8 = upstart(pcVar8);
  pcVar8 = s_suffix(pcVar8);
  pcVar9 = aobjnam(poVar7,"glow");
  pcVar12 = "black";
  if ((poVar7->field_0x4a & 1) == 0) {
    pcVar12 = "brown";
  }
  pcVar12 = hcolor(pcVar12);
  pline("%s %s %s.",pcVar8,pcVar9,pcVar12);
  poVar7->field_0x4a = poVar7->field_0x4a | 0x40;
  return;
}

Assistant:

void rndcurse(void)
{
	int	nobj = 0;
	int	cnt, onum;
	struct	obj	*otmp;
	static const char mal_aura[] = "You feel a malignant aura surround %s.";

	if (uwep && (uwep->oartifact == ART_MAGICBANE) && rn2(20)) {
	    pline(mal_aura, "the magic-absorbing blade");
	    return;
	}

	if (Antimagic) {
	    shieldeff(u.ux, u.uy);
	    pline(mal_aura, "you");
	}

	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    /* gold isn't subject to being cursed or blessed */
	    if (otmp->oclass == COIN_CLASS) continue;
	    nobj++;
	}
	if (nobj) {
	    for (cnt = rnd(6/((!!Antimagic) + (!!Half_spell_damage) + 1));
		 cnt > 0; cnt--)  {
		char Your_buf[BUFSZ];

		onum = rnd(nobj);
		for (otmp = invent; otmp; otmp = otmp->nobj) {
		    /* as above */
		    if (otmp->oclass == COIN_CLASS) continue;
		    if (--onum == 0) break;	/* found the target */
		}
		/* the !otmp case should never happen; picking an already
		   cursed item happens--avoid "resists" message in that case */
		if (!otmp || otmp->cursed) continue;	/* next target */

		if (otmp->oartifact && spec_ability(otmp, SPFX_INTEL) &&
		   rn2(10) < 8) {
		    pline("%s!", Tobjnam(otmp, "resist"));
		    continue;
		}

		if (!Blind) Shk_Your(Your_buf, otmp);
		if (otmp->blessed) {
		    if (flags.verbose && !Blind) {
			pline("%s %s %s.",
			      Your_buf,
			      aobjnam(otmp, "glow"),
			      hcolor("brown"));
		    }
		    unbless(otmp);
		} else {
		    if (flags.verbose && !Blind) {
			pline("%s %s with %s aura.",
			      Your_buf,
			      aobjnam(otmp, "glow"),
			      an(hcolor("black")));
		    }
		    curse(otmp);
		}
		otmp->bknown = TRUE;
	    }
	    update_inventory();
	}

	/* treat steed's saddle as extended part of hero's inventory */
	if (u.usteed && !rn2(4) &&
		(otmp = which_armor(u.usteed, W_SADDLE)) != 0 &&
		!otmp->cursed) {	/* skip if already cursed */
	    if (otmp->blessed)
		unbless(otmp);
	    else
		curse(otmp);
	    if (!Blind) {
		pline("%s %s %s.",
		      s_suffix(upstart(y_monnam(u.usteed))),
		      aobjnam(otmp, "glow"),
		      hcolor(otmp->cursed ? "black" : "brown"));
		otmp->bknown = TRUE;
	    }
	}
}